

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

iterator * __thiscall Catch::clara::TextFlow::Column::iterator::operator++(iterator *this)

{
  bool bVar1;
  pointer pbVar2;
  ulong uVar3;
  Column *pCVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar5 = this->m_pos + this->m_len;
  this->m_pos = uVar5;
  pCVar4 = this->m_column;
  uVar3 = this->m_stringIndex;
  pbVar2 = (pCVar4->m_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = *(size_type *)((long)(pbVar2 + uVar3) + 8);
  if ((uVar5 < uVar6) && (*(char *)(*(long *)&pbVar2[uVar3]._M_dataplus + uVar5) == '\n')) {
    uVar5 = uVar5 + 1;
    this->m_pos = uVar5;
  }
  else {
    while (uVar5 < uVar6) {
      bVar1 = isWhitespace(*(char *)(*(long *)&pbVar2[uVar3]._M_dataplus + uVar5));
      uVar5 = this->m_pos;
      pCVar4 = this->m_column;
      uVar3 = this->m_stringIndex;
      if (!bVar1) {
        pbVar2 = (pCVar4->m_strings).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        break;
      }
      uVar5 = uVar5 + 1;
      this->m_pos = uVar5;
      pbVar2 = (pCVar4->m_strings).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(size_type *)((long)(pbVar2 + uVar3) + 8);
    }
  }
  if (uVar5 == *(size_type *)((long)(pbVar2 + uVar3) + 8)) {
    this->m_pos = 0;
    uVar3 = uVar3 + 1;
    this->m_stringIndex = uVar3;
  }
  if (uVar3 < (ulong)((long)(pCVar4->m_strings).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)) {
    calcLength(this);
  }
  return this;
}

Assistant:

auto operator++() -> iterator & {
            m_pos += m_len;
            if (m_pos < line().size() && line()[m_pos] == '\n')
              m_pos += 1;
            else
              while (m_pos < line().size() && isWhitespace(line()[m_pos]))
                ++m_pos;

            if (m_pos == line().size()) {
              m_pos = 0;
              ++m_stringIndex;
            }
            if (m_stringIndex < m_column.m_strings.size())
              calcLength();
            return *this;
          }